

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptExpr.cpp
# Opt level: O0

void __thiscall
GlobOpt::CSEAddInstr
          (GlobOpt *this,BasicBlock *block,Instr *instr,Value *dstVal,Value *src1Val,Value *src2Val,
          Value *dstIndirIndexVal,Value *src1IndirIndexVal)

{
  OpCode OVar1;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  code *pcVar2;
  bool bVar3;
  bool isSrcUnsigned;
  BailOutKind BVar4;
  uint i;
  ValueInfo *pVVar5;
  Opnd *pOVar6;
  Sym *pSVar7;
  undefined4 *puVar8;
  StackSym *newSym;
  Value **ppVVar9;
  RegOpnd *pRVar10;
  StackSym *local_b0;
  StackSym *varSym_1;
  Opnd *src2;
  StackSym *varSym;
  Opnd *src1;
  Value **pVal;
  StackSym *constStackSym;
  int32 intConstantValue;
  ValueInfo *valueInfo;
  IntMathExprAttributes local_60;
  DstIsIntOrNumberAttributes local_5c;
  Value *local_58;
  Value *indirIndexVal;
  IndirOpnd *arrayOpnd;
  ExprHash local_40;
  ExprAttributes EStack_3c;
  bool isArray;
  ExprHash hash;
  ExprAttributes exprAttributes;
  Value *src2Val_local;
  Value *src1Val_local;
  Value *dstVal_local;
  Instr *instr_local;
  BasicBlock *block_local;
  GlobOpt *this_local;
  
  _hash = src2Val;
  ExprAttributes::ExprAttributes(&stack0xffffffffffffffc4,0);
  ExprHash::ExprHash(&local_40);
  bVar3 = DoCSE(this);
  if (!bVar3) {
    return;
  }
  arrayOpnd._7_1_ = 0;
  OVar1 = instr->m_opcode;
  src1Val_local = dstVal;
  if (((OVar1 == LdElemI_A) || (OVar1 == StElemI_A)) || (OVar1 == StElemI_A_Strict)) {
LAB_005fc58e:
    if ((instr->m_opcode == StElemI_A) || (instr->m_opcode == StElemI_A_Strict)) {
      bVar3 = CanCSEArrayStore(this,instr);
      if (!bVar3) {
        return;
      }
      pOVar6 = IR::Instr::GetDst(instr);
      indirIndexVal = (Value *)IR::Opnd::AsIndirOpnd(pOVar6);
      local_58 = dstIndirIndexVal;
      src1Val_local = src1Val;
    }
    else {
      pOVar6 = IR::Instr::GetSrc1(instr);
      indirIndexVal = (Value *)IR::Opnd::AsIndirOpnd(pOVar6);
      local_58 = src1IndirIndexVal;
    }
    pRVar10 = IR::IndirOpnd::GetBaseOpnd((IndirOpnd *)indirIndexVal);
    src2Val_local = GlobOptBlockData::FindValue(&block->globOptData,&pRVar10->m_sym->super_Sym);
    if (local_58 == (Value *)0x0) {
      pRVar10 = IR::IndirOpnd::GetIndexOpnd((IndirOpnd *)indirIndexVal);
      if (pRVar10 == (RegOpnd *)0x0) {
        return;
      }
      pRVar10 = IR::IndirOpnd::GetIndexOpnd((IndirOpnd *)indirIndexVal);
      _hash = GlobOptBlockData::FindValue(&block->globOptData,&pRVar10->m_sym->super_Sym);
    }
    else {
      _hash = local_58;
    }
    arrayOpnd._7_1_ = 1;
    pVVar5 = ::Value::GetValueInfo(src2Val_local);
    bVar3 = ValueType::IsLikelyOptimizedVirtualTypedArray(&pVVar5->super_ValueType);
    if (bVar3) {
      DstIsIntOrNumberAttributes::DstIsIntOrNumberAttributes
                (&local_5c,
                 (bool)(((byte)((ushort)*(undefined2 *)&instr->field_0x36 >> 0xe) & 1 ^ 0xff) & 1),
                 (bool)(((byte)((ushort)*(undefined2 *)&instr->field_0x36 >> 0xf) ^ 0xff) & 1));
      EStack_3c = local_5c.super_ExprAttributes.attributes;
    }
  }
  else {
    src2Val_local = src1Val;
    if ((OVar1 != Neg_I4) && (1 < (ushort)(OVar1 - Add_I4))) {
      if (OVar1 == Mul_I4) {
        bVar3 = IR::Instr::HasBailOutInfo(instr);
        if (bVar3) {
          BVar4 = IR::Instr::GetBailOutKind(instr);
          BVar4 = IR::operator&(BVar4,BailOutOnMulOverflow);
          if (((BVar4 != BailOutInvalid) &&
              (bVar3 = IR::Instr::ShouldCheckFor32BitOverflow(instr), !bVar3)) &&
             (instr->ignoreOverflowBitCount != '5')) {
            return;
          }
        }
      }
      else if ((3 < (ushort)(OVar1 - Div_I4)) && (OVar1 != ShrU_I4)) {
        if ((ushort)(OVar1 - Conv_Prim) < 2) {
          pOVar6 = IR::Instr::GetDst(instr);
          bVar3 = IR::Opnd::IsUnsigned(pOVar6);
          pOVar6 = IR::Instr::GetSrc1(instr);
          isSrcUnsigned = IR::Opnd::IsUnsigned(pOVar6);
          ConvAttributes::ConvAttributes
                    ((ConvAttributes *)((long)&valueInfo + 4),bVar3,isSrcUnsigned);
          EStack_3c.attributes = valueInfo._4_4_;
          goto LAB_005fc7c7;
        }
        if (OVar1 != LdArrViewElem) {
          if ((((ushort)(OVar1 - InlineMathCeil) < 2) || (OVar1 == InlineMathRound)) &&
             (bVar3 = IR::Instr::ShouldCheckForNegativeZero(instr), !bVar3)) {
            return;
          }
          goto LAB_005fc7c7;
        }
        goto LAB_005fc58e;
      }
    }
    IntMathExprAttributes::IntMathExprAttributes
              (&local_60,(bool)((byte)(*(uint *)&this->field_0xf4 >> 2) & 1),
               (bool)((byte)(*(uint *)&this->field_0xf4 >> 3) & 1));
    EStack_3c = local_60.super_ExprAttributes.attributes;
  }
LAB_005fc7c7:
  _intConstantValue = (ValueInfo *)0x0;
  pOVar6 = IR::Instr::GetDst(instr);
  if (pOVar6 != (Opnd *)0x0) {
    if (src1Val_local == (Value *)0x0) {
      return;
    }
    _intConstantValue = ::Value::GetValueInfo(src1Val_local);
    pSVar7 = ValueInfo::GetSymStore(_intConstantValue);
    if (pSVar7 == (Sym *)0x0) {
      if ((arrayOpnd._7_1_ & 1) == 0) {
        return;
      }
      bVar3 = ValueInfo::HasIntConstantValue(_intConstantValue,false);
      if (!bVar3) {
        return;
      }
      bVar3 = ValueType::IsIntAndLikelyTagged(&_intConstantValue->super_ValueType);
      if (!bVar3) {
        return;
      }
      pOVar6 = IR::Instr::GetSrc1(instr);
      bVar3 = IR::Opnd::IsAddrOpnd(pOVar6);
      if (!bVar3) {
        return;
      }
    }
  }
  constStackSym._4_4_ = EStack_3c.attributes;
  bVar3 = GetHash(this,instr,src2Val_local,_hash,EStack_3c,&local_40);
  if (bVar3) {
    if (((_intConstantValue != (ValueInfo *)0x0) &&
        (pSVar7 = ValueInfo::GetSymStore(_intConstantValue), pSVar7 == (Sym *)0x0)) &&
       (bVar3 = ValueInfo::TryGetIntConstantValue(_intConstantValue,(int32 *)&constStackSym,false),
       bVar3)) {
      if ((arrayOpnd._7_1_ & 1) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                           ,0x137,"(isArray)","isArray");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      bVar3 = ValueType::IsIntAndLikelyTagged(&_intConstantValue->super_ValueType);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                           ,0x138,"(valueInfo->IsIntAndLikelyTagged())",
                           "valueInfo->IsIntAndLikelyTagged()");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      pOVar6 = IR::Instr::GetSrc1(instr);
      bVar3 = IR::Opnd::IsAddrOpnd(pOVar6);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                           ,0x139,"(instr->GetSrc1()->IsAddrOpnd())",
                           "instr->GetSrc1()->IsAddrOpnd()");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      newSym = GetOrCreateTaggedIntConstantStackSym(this,(int32)constStackSym);
      IR::Instr::HoistSrc1(instr,Ld_A,RegNOREG,newSym);
      GlobOptBlockData::SetValue(&this->currentBlock->globOptData,src1Val_local,&newSym->super_Sym);
    }
    ppVVar9 = ValueHashTable<ExprHash,_Value_*>::FindOrInsertNew
                        ((block->globOptData).exprToValueMap,local_40);
    *ppVVar9 = src1Val_local;
    if ((arrayOpnd._7_1_ & 1) != 0) {
      this_00 = (block->globOptData).liveArrayValues;
      i = ExprHash::operator_cast_to_unsigned_int(&local_40);
      BVSparse<Memory::JitArenaAllocator>::Set(this_00,i);
    }
    bVar3 = MayNeedBailOnImplicitCall(instr,src2Val_local,_hash);
    if (bVar3) {
      (this->currentBlock->globOptData).hasCSECandidates = true;
      pOVar6 = IR::Instr::GetSrc1(instr);
      if (pOVar6 != (Opnd *)0x0) {
        bVar3 = IR::Opnd::IsRegOpnd(pOVar6);
        if (bVar3) {
          pRVar10 = IR::Opnd::AsRegOpnd(pOVar6);
          src2 = (Opnd *)pRVar10->m_sym;
          bVar3 = StackSym::IsTypeSpec((StackSym *)src2);
          if (bVar3) {
            src2 = (Opnd *)StackSym::GetVarEquivSym((StackSym *)src2,this->func);
          }
          BVSparse<Memory::JitArenaAllocator>::Set
                    ((block->globOptData).liveFields,*(BVIndex *)&src2[1]._vptr_Opnd);
        }
        pOVar6 = IR::Instr::GetSrc2(instr);
        if ((pOVar6 != (Opnd *)0x0) && (bVar3 = IR::Opnd::IsRegOpnd(pOVar6), bVar3)) {
          pRVar10 = IR::Opnd::AsRegOpnd(pOVar6);
          local_b0 = pRVar10->m_sym;
          bVar3 = StackSym::IsTypeSpec(local_b0);
          if (bVar3) {
            local_b0 = StackSym::GetVarEquivSym(local_b0,this->func);
          }
          BVSparse<Memory::JitArenaAllocator>::Set
                    ((block->globOptData).liveFields,(local_b0->super_Sym).m_id);
        }
      }
    }
  }
  return;
}

Assistant:

void
GlobOpt::CSEAddInstr(
    BasicBlock *block,
    IR::Instr *instr,
    Value *dstVal,
    Value *src1Val,
    Value *src2Val,
    Value *dstIndirIndexVal,
    Value *src1IndirIndexVal)
{
    ExprAttributes exprAttributes;
    ExprHash hash;

    if (!this->DoCSE())
    {
        return;
    }

    bool isArray = false;

    switch(instr->m_opcode)
    {
    case Js::OpCode::LdElemI_A:
    case Js::OpCode::LdArrViewElem:
    case Js::OpCode::StElemI_A:
    case Js::OpCode::StElemI_A_Strict:
    {
        // For arrays, hash the value # of the baseOpnd and indexOpnd
        IR::IndirOpnd *arrayOpnd;
        Value *indirIndexVal;
        if (instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict)
        {
            if (!this->CanCSEArrayStore(instr))
            {
                return;
            }
            dstVal = src1Val;
            arrayOpnd = instr->GetDst()->AsIndirOpnd();
            indirIndexVal = dstIndirIndexVal;
        }
        else
        {
            // all the LdElem and Ld*ArrViewElem
            arrayOpnd = instr->GetSrc1()->AsIndirOpnd();
            indirIndexVal = src1IndirIndexVal;
        }

        src1Val = block->globOptData.FindValue(arrayOpnd->GetBaseOpnd()->m_sym);
        if(indirIndexVal)
        {
            src2Val = indirIndexVal;
        }
        else if (arrayOpnd->GetIndexOpnd())
        {
            src2Val = block->globOptData.FindValue(arrayOpnd->GetIndexOpnd()->m_sym);
        }
        else
        {
            return;
        }
        isArray = true;

        // for typed array do not add instructions whose dst are guaranteed to be int or number
        // as we will try to eliminate bound check for these typed arrays
        if (src1Val->GetValueInfo()->IsLikelyOptimizedVirtualTypedArray())
        {
            exprAttributes = DstIsIntOrNumberAttributes(!instr->dstIsAlwaysConvertedToInt32, !instr->dstIsAlwaysConvertedToNumber);
        }
        break;
    }

    case Js::OpCode::Mul_I4:
        // If int32 overflow is ignored, we only add MULs with 53-bit overflow check to expr map
        if (instr->HasBailOutInfo() && (instr->GetBailOutKind() & IR::BailOutOnMulOverflow) &&
            !instr->ShouldCheckFor32BitOverflow() && instr->ignoreOverflowBitCount != 53)
        {
            return;
        }

        // fall-through

    case Js::OpCode::Neg_I4:
    case Js::OpCode::Add_I4:
    case Js::OpCode::Sub_I4:
    case Js::OpCode::DivU_I4:
    case Js::OpCode::Div_I4:
    case Js::OpCode::RemU_I4:
    case Js::OpCode::Rem_I4:
    case Js::OpCode::ShrU_I4:
    {
        // Can't CSE and Add where overflow doesn't matter (and no bailout) with one where it does matter... Record whether int
        // overflow or negative zero were ignored.
        exprAttributes = IntMathExprAttributes(ignoredIntOverflowForCurrentInstr, ignoredNegativeZeroForCurrentInstr);
        break;
    }

    case Js::OpCode::InlineMathFloor:
    case Js::OpCode::InlineMathCeil:
    case Js::OpCode::InlineMathRound:
        if (!instr->ShouldCheckForNegativeZero())
        {
            return;
        }
        break;

    case Js::OpCode::Conv_Prim:
    case Js::OpCode::Conv_Prim_Sat:
        exprAttributes = ConvAttributes(instr->GetDst()->IsUnsigned(), instr->GetSrc1()->IsUnsigned());
        break;
    }

    ValueInfo *valueInfo = NULL;

    if (instr->GetDst())
    {
        if (!dstVal)
        {
            return;
        }

        valueInfo = dstVal->GetValueInfo();
        if(valueInfo->GetSymStore() == NULL &&
            !(isArray && valueInfo->HasIntConstantValue() && valueInfo->IsIntAndLikelyTagged() && instr->GetSrc1()->IsAddrOpnd()))
        {
            return;
        }
    }

    if (!this->GetHash(instr, src1Val, src2Val, exprAttributes, &hash))
    {
        return;
    }

    int32 intConstantValue;
    if(valueInfo && !valueInfo->GetSymStore() && valueInfo->TryGetIntConstantValue(&intConstantValue))
    {
        Assert(isArray);
        Assert(valueInfo->IsIntAndLikelyTagged());
        Assert(instr->GetSrc1()->IsAddrOpnd());

        // We need a sym associated with a value in the expression value table. Hoist the address into a stack sym associated
        // with the int constant value.
        StackSym *const constStackSym = GetOrCreateTaggedIntConstantStackSym(intConstantValue);
        instr->HoistSrc1(Js::OpCode::Ld_A, RegNOREG, constStackSym);
        currentBlock->globOptData.SetValue(dstVal, constStackSym);
    }

    // We have a candidate.  Add it to the exprToValueMap.
    Value ** pVal = block->globOptData.exprToValueMap->FindOrInsertNew(hash);
    *pVal = dstVal;

    if (isArray)
    {
        block->globOptData.liveArrayValues->Set(hash);
    }

    if (MayNeedBailOnImplicitCall(instr, src1Val, src2Val))
    {
        this->currentBlock->globOptData.hasCSECandidates = true;

        // Use LiveFields to track is object.valueOf/toString could get overridden.
        IR::Opnd *src1 = instr->GetSrc1();
        if (src1)
        {
            if (src1->IsRegOpnd())
            {
                StackSym *varSym = src1->AsRegOpnd()->m_sym;

                if (varSym->IsTypeSpec())
                {
                    varSym = varSym->GetVarEquivSym(this->func);
                }
                block->globOptData.liveFields->Set(varSym->m_id);
            }
            IR::Opnd *src2 = instr->GetSrc2();
            if (src2 && src2->IsRegOpnd())
            {
                StackSym *varSym = src2->AsRegOpnd()->m_sym;

                if (varSym->IsTypeSpec())
                {
                    varSym = varSym->GetVarEquivSym(this->func);
                }
                block->globOptData.liveFields->Set(varSym->m_id);
            }
        }
    }
}